

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObjectManager::Initialize(CSharedMemoryObjectManager *this)

{
  PAL_ERROR PVar1;
  PAL_ERROR palError;
  CSharedMemoryObjectManager *this_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  (this->m_leNamedObjects).Blink = &this->m_leNamedObjects;
  (this->m_leNamedObjects).Flink = &this->m_leNamedObjects;
  (this->m_leAnonymousObjects).Blink = &this->m_leAnonymousObjects;
  (this->m_leAnonymousObjects).Flink = &this->m_leAnonymousObjects;
  InternalInitializeCriticalSection(&this->m_csListLock);
  this->m_fListLockInitialized = true;
  PVar1 = CSimpleHandleManager::Initialize(&this->m_HandleManager);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return PVar1;
}

Assistant:

PAL_ERROR
CSharedMemoryObjectManager::Initialize(
    void
    )
{
    PAL_ERROR palError = NO_ERROR;

    ENTRY("CSharedMemoryObjectManager::Initialize (this=%p)\n", this);
    
    InitializeListHead(&m_leNamedObjects);
    InitializeListHead(&m_leAnonymousObjects);

    InternalInitializeCriticalSection(&m_csListLock);
    m_fListLockInitialized = TRUE;

    palError = m_HandleManager.Initialize();

    LOGEXIT("CSharedMemoryObjectManager::Initialize returns %d", palError);
    
    return palError;
}